

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlog.cxx
# Opt level: O0

string * zpsoe::zlog::errno_to_str_abi_cxx11_(void)

{
  int *piVar1;
  char *__s;
  zlog *this;
  int *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string local_a8;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  piVar1 = __errno_location();
  __s = strerror(*piVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_71);
  std::operator+(&local_50,&local_70,"(errno: ");
  this = (zlog *)__errno_location();
  int_to_str_abi_cxx11_(&local_a8,this,value);
  std::operator+(&local_30,&local_50,&local_a8);
  std::operator+(in_RDI,&local_30,")");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return in_RDI;
}

Assistant:

string errno_to_str() {
#ifdef PLATFORM_WIN32
    string msg_(_strerror(NULL));
    const size_t size_ = msg_.size();

    if (size_) msg_.erase(size_-1);

    return msg_ + "(errno: " + int_to_str(errno) + ")";
#else
    return string(strerror(errno)) + "(errno: " + int_to_str(errno) + ")";
#endif
}